

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::Append(ON_NurbsCurve *this,ON_NurbsCurve *c)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double *__dest;
  uint uVar10;
  double dVar11;
  double dVar12;
  ON_NurbsCurve tmp;
  int local_a4;
  double local_a0;
  ON_NurbsCurve local_88;
  double local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  if (this->m_cv_count == 0) {
    operator=(this,c);
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
    return SUB41(iVar2,0);
  }
  if (((c->m_is_rat != 0) && (this->m_is_rat == 0)) && (bVar1 = MakeRational(this), !bVar1)) {
    return false;
  }
  iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
  if (iVar3 < iVar2) {
    iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
    bVar1 = IncreaseDegree(this,iVar2);
    if (!bVar1) {
      return false;
    }
  }
  iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
  if (iVar3 < iVar2) {
    uVar4 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
                      (this,(ulong)uVar4);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  if ((this->m_is_rat == 0) || (c->m_is_rat != 0)) {
    iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
    if ((iVar3 <= iVar2) &&
       (bVar1 = ON_IsKnotVectorClamped(c->m_order,c->m_cv_count,c->m_knot,0), bVar1)) {
      iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
      iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                        (this);
      if (iVar3 <= iVar2) {
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                          (this,0);
        if ((char)iVar2 == '\0') {
          return false;
        }
        iVar2 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(c,0);
        if ((char)iVar2 == '\0') {
          return false;
        }
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])
                          (this);
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(c);
        if (iVar2 != iVar3) {
          return false;
        }
        if ((c->m_is_rat != 0) != (this->m_is_rat != 0)) {
          return false;
        }
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                          (this);
        iVar3 = (*(c->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(c);
        if (iVar2 != iVar3) {
          return false;
        }
        bVar1 = ClampEnd(this,1);
        if (!bVar1) {
          return false;
        }
        dVar12 = 1.0;
        if ((c->m_cv != (double *)0x0) && (c->m_is_rat != 0)) {
          dVar12 = c->m_cv[c->m_dim];
        }
        if (this->m_is_rat == 0 || this->m_cv == (double *)0x0) {
          iVar2 = this->m_cv_stride;
          dVar11 = 1.0;
        }
        else {
          iVar2 = this->m_cv_stride;
          dVar11 = this->m_cv[(long)((this->m_cv_count + -1) * iVar2) + (long)this->m_dim];
        }
        if (this->m_is_rat == 0) {
          local_48 = 1.0;
        }
        else {
          local_48 = (double)(~-(ulong)(dVar12 != dVar11) & 0x3ff0000000000000 |
                             (ulong)(dVar11 / dVar12) & -(ulong)(dVar12 != dVar11));
        }
        uStack_40 = 0;
        ReserveCVCapacity(this,(this->m_cv_count + c->m_cv_count) * iVar2);
        iVar2 = ON_KnotCount(this->m_order,c->m_cv_count + this->m_cv_count);
        ReserveKnotCapacity(this,iVar2);
        dVar12 = 0.0;
        local_a0 = 0.0;
        if (this->m_knot != (double *)0x0) {
          local_a0 = this->m_knot[(long)this->m_cv_count + -1];
        }
        if (c->m_knot != (double *)0x0) {
          dVar12 = c->m_knot[(long)c->m_order + -2];
        }
        iVar2 = ON_KnotCount(c->m_order,c->m_cv_count);
        local_a4 = ON_KnotCount(this->m_order,this->m_cv_count);
        if (c->m_order <= iVar2) {
          uVar4 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
          if (this->m_dim < 1) {
            uVar4 = 0;
          }
          __dest = this->m_cv + ((long)this->m_cv_count + -1) * (long)this->m_cv_stride;
          if (this->m_cv == (double *)0x0) {
            __dest = (double *)0x0;
          }
          local_38 = (size_t)(int)(uVar4 * 8);
          bVar1 = local_48 != 1.0;
          lVar8 = (long)(c->m_order + -1);
          iVar3 = 1;
          do {
            if (c->m_knot == (double *)0x0) {
              dVar11 = 0.0;
            }
            else {
              dVar11 = c->m_knot[lVar8];
            }
            dVar11 = dVar11 + (local_a0 - dVar12);
            lVar7 = (long)local_a4;
            pdVar9 = this->m_knot + (lVar7 - this->m_order) + 1;
            if (*pdVar9 <= dVar11 && dVar11 != *pdVar9) {
              local_a4 = local_a4 + 1;
              this->m_knot[lVar7] = dVar11;
              __dest = __dest + this->m_cv_stride;
              this->m_cv_count = this->m_cv_count + 1;
            }
            pdVar9 = c->m_cv + (long)iVar3 * (long)c->m_cv_stride;
            if (c->m_cv == (double *)0x0) {
              pdVar9 = (double *)0x0;
            }
            memcpy(__dest,pdVar9,local_38);
            if (uVar4 != 0 && bVar1) {
              uVar6 = 0;
              do {
                __dest[uVar6] = __dest[uVar6] * local_48;
                uVar6 = uVar6 + 1;
              } while (uVar4 != uVar6);
            }
            lVar8 = lVar8 + 1;
            iVar3 = iVar3 + 1;
          } while (iVar2 != (int)lVar8);
          return true;
        }
        return true;
      }
    }
  }
  ON_NurbsCurve(&local_88,c);
  iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])(this);
  bVar1 = IncreaseDegree(&local_88,iVar2);
  if (bVar1) {
    iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    bVar1 = ChangeDimension(&local_88,iVar2);
    if ((bVar1) && ((this->m_is_rat == 0 || (bVar1 = MakeRational(&local_88), bVar1)))) {
      iVar2 = 0;
      if (0 < local_88.m_dim) {
        iVar2 = (local_88.m_dim + 1) - (uint)(local_88.m_is_rat == 0);
      }
      bVar1 = ON_ClampKnotVector(iVar2,local_88.m_order,local_88.m_cv_count,local_88.m_cv_stride,
                                 local_88.m_cv,local_88.m_knot,0);
      iVar2 = local_88.m_order;
      if ((bVar1) && ((this->m_is_rat != 0) == (local_88.m_is_rat != 0))) {
        uVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])
                          (this);
        uVar10 = 0;
        uVar4 = iVar2 - 1;
        if (iVar2 < 2) {
          uVar4 = uVar10;
        }
        if (uVar4 != uVar5) goto LAB_0053ab40;
        iVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                          (this);
        if ((local_88.m_dim == iVar2) &&
           (bVar1 = ON_IsKnotVectorClamped(local_88.m_order,local_88.m_cv_count,local_88.m_knot,0),
           bVar1)) {
          bVar1 = Append(this,&local_88);
          uVar10 = (uint)bVar1;
          goto LAB_0053ab40;
        }
      }
    }
  }
  uVar10 = 0;
LAB_0053ab40:
  ~ON_NurbsCurve(&local_88);
  return SUB41(uVar10,0);
}

Assistant:

bool ON_NurbsCurve::Append( const ON_NurbsCurve& c )
{
  bool rc = false;

  if ( CVCount() == 0 ) {
    *this = c;
    return IsValid()?true:false;
  }

  if ( c.IsRational() && !IsRational() ) {
    if ( !MakeRational() )
      return false;
  }
  if ( c.Degree() > Degree() ) {
    if ( !IncreaseDegree( c.Degree() ) )
      return false;
  }
  if ( c.Dimension() > Dimension() ) {
    if ( !ChangeDimension( c.Dimension() ) )
      return false;
  }

  if (    (IsRational() && !c.IsRational())
       || c.Degree() < Degree() 
       || !c.IsClamped(0) 
       || c.Dimension() < Dimension() ) 
  {
    ON_NurbsCurve tmp(c);
    if ( !tmp.IncreaseDegree( Degree() ) )
      return false;
    if ( !tmp.ChangeDimension( Dimension() ) )
      return false;
    if ( IsRational() ) {
      if ( !tmp.MakeRational() )
        return false;
    }
    if ( !tmp.ClampEnd(0) )
      return false;

    // make sure we don't reenter this scope
    if ( tmp.IsRational() != IsRational() )
      return false;
    if ( tmp.Degree() != Degree() )
      return false;
    if ( tmp.Dimension() != Dimension() )
      return false;
    if ( !tmp.IsClamped(0) )
      return false;
    return Append(tmp);
  }

  if (    IsValid() 
       && c.IsValid() 
       && Degree() == c.Degree() 
       && IsRational() == c.IsRational() 
       && Dimension() == c.Dimension() ) 
  {
    if ( !ClampEnd(1) )
      return false;
    const double w0 = c.Weight(0);
    const double w1 = Weight(CVCount()-1);
    double w = 1.0;
    if ( IsRational() && w0 != w1 ) {
      w = w1/w0;
    }
    ReserveCVCapacity( (CVCount()+c.CVCount())*m_cv_stride );
    ReserveKnotCapacity( ON_KnotCount(Order(),CVCount()+c.CVCount()) );
    const double dk = Knot(CVCount()-1) - c.Knot(c.Order()-2);


    //const int c_cv_count = c.CVCount();
    const int c_knot_count = c.KnotCount();
    int i0, i1, i2, j;

		// i0 and cv index into m_knot and m_cv respectively 
		i0 = KnotCount();
		double* cv = CV(CVCount() - 1);
		const int cv_dim = CVSize();
		const int sizeof_cv = cv_dim * sizeof(*cv);

		// i1 and i2 index c's knots and cvs respectively
		i2 = 1;
		for ( i1 = c.Order()-1; i1 < c_knot_count; i1++, i2++ ) {
			double knot = c.Knot(i1) + dk;
			// GBA 20-April-2017  Check for span collapse
			if (knot > m_knot[i0 - Order() + 1])
			{
				m_knot[i0++] = knot;
				cv += m_cv_stride;
				m_cv_count++;
			}
			memcpy(cv, c.CV(i2), sizeof_cv);
			if (w != 1.0) {
				for (j = 0; j < cv_dim; j++)
					cv[j] *= w;
			}	
		}

    rc = true;
  }
  return rc;
}